

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O3

bool __thiscall duckdb::ARTKey::operator>(ARTKey *this,ARTKey *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = this->len;
  uVar2 = key->len;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    bVar4 = uVar2 < uVar1;
  }
  else {
    bVar4 = *this->data;
    bVar5 = *key->data;
    bVar7 = true;
    uVar6 = 1;
    if (bVar4 <= bVar5) {
      uVar6 = 1;
      do {
        if (bVar4 < bVar5) {
          uVar6 = 0;
          goto LAB_016e3986;
        }
        bVar7 = uVar6 < uVar3;
        if (uVar6 == uVar3) goto LAB_016e3986;
        bVar4 = this->data[uVar6];
        bVar5 = key->data[uVar6];
        uVar6 = uVar6 + 1;
      } while (bVar4 <= bVar5);
      uVar6 = 1;
    }
LAB_016e3986:
    bVar4 = (byte)uVar6;
    if (!bVar7) {
      bVar4 = uVar2 < uVar1;
    }
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool ARTKey::operator>(const ARTKey &key) const {
	for (idx_t i = 0; i < MinValue(len, key.len); i++) {
		if (data[i] > key.data[i]) {
			return true;
		} else if (data[i] < key.data[i]) {
			return false;
		}
	}
	return len > key.len;
}